

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regexcmp.cpp
# Opt level: O2

void __thiscall icu_63::RegexCompile::nextChar(RegexCompile *this,RegexPatternChar *c)

{
  int iVar1;
  uint uVar2;
  UText *pUVar3;
  UBool UVar4;
  int iVar5;
  UChar32 UVar6;
  uint uVar7;
  int64_t iVar8;
  long lVar9;
  int64_t index;
  UnicodeSet *this_00;
  int32_t offset;
  int32_t endIndex;
  undefined4 uStack_34;
  uint local_30;
  
  pUVar3 = this->fRXPat->fPattern;
  if (pUVar3->nativeIndexingLimit < pUVar3->chunkOffset) {
    iVar8 = (*pUVar3->pFuncs->mapOffsetToNative)(pUVar3);
  }
  else {
    iVar8 = (long)pUVar3->chunkOffset + pUVar3->chunkNativeStart;
  }
  this->fScanIndex = iVar8;
  iVar5 = nextCharLL(this);
  c->fChar = iVar5;
  c->fQuoted = '\0';
  if (this->fQuoteMode == '\0') {
    if (this->fInBackslashQuote != '\0') {
      this->fInBackslashQuote = '\0';
      goto LAB_00265af6;
    }
    if ((this->fModeFlags & 4) != 0) {
      do {
        if (iVar5 == 0x23) {
          iVar5 = 0x23;
          if (this->fEOLComments == '\x01') {
            do {
              iVar5 = nextCharLL(this);
              c->fChar = iVar5;
              if (((iVar5 + 1U < 0xf) && ((0x4801U >> (iVar5 + 1U & 0x1f) & 1) != 0)) ||
                 (iVar5 == 0x2028)) break;
            } while (iVar5 != 0x85);
          }
        }
        else if (iVar5 == -1) goto LAB_00265af6;
        UVar4 = PatternProps::isWhiteSpace(iVar5);
        if (UVar4 == '\0') goto LAB_00265b6c;
        iVar5 = nextCharLL(this);
        c->fChar = iVar5;
      } while( true );
    }
    goto LAB_00265b6f;
  }
  c->fQuoted = '\x01';
  if (iVar5 == 0x5c) {
    UVar6 = peekCharLL(this);
    iVar5 = c->fChar;
    if (UVar6 != 0x45) goto LAB_00265ace;
    if (iVar5 != -1 && (this->fModeFlags & 0x10) != 0) goto LAB_00265af6;
  }
  else {
LAB_00265ace:
    if (iVar5 != -1) goto LAB_00265af6;
  }
  this->fQuoteMode = '\0';
LAB_00265ad7:
  nextCharLL(this);
  nextChar(this,c);
LAB_00265af6:
  this->fEOLComments = '\x01';
  return;
LAB_00265b6c:
  iVar5 = c->fChar;
LAB_00265b6f:
  if (iVar5 != 0x5c) goto LAB_00265af6;
  pUVar3 = this->fRXPat->fPattern;
  if (pUVar3->nativeIndexingLimit < pUVar3->chunkOffset) {
    iVar8 = (*pUVar3->pFuncs->mapOffsetToNative)(pUVar3);
  }
  else {
    iVar8 = (long)pUVar3->chunkOffset + pUVar3->chunkNativeStart;
  }
  this_00 = (UnicodeSet *)(RegexStaticSets::gStaticSets + 0x578);
  UVar6 = peekCharLL(this);
  UVar4 = UnicodeSet::contains(this_00,UVar6);
  if (UVar4 != '\0') {
    nextCharLL(this);
    c->fQuoted = '\x01';
    pUVar3 = this->fRXPat->fPattern;
    if (((pUVar3->chunkNativeStart == 0) &&
        (lVar9 = this->fPatternLength, lVar9 == pUVar3->chunkNativeLimit)) &&
       (lVar9 == pUVar3->nativeIndexingLimit)) {
      _endIndex = (UText *)CONCAT44(uStack_34,(int)iVar8);
      UVar6 = u_unescapeAt_63(uregex_ucstr_unescape_charAt_63,&endIndex,(int32_t)lVar9,
                              pUVar3->chunkContents);
      c->fChar = UVar6;
      index = (int64_t)endIndex;
      if (iVar8 == index) {
        error(this,U_REGEX_BAD_ESCAPE_SEQUENCE);
        index = (int64_t)endIndex;
      }
      this->fCharNum = this->fCharNum + (index - iVar8);
      pUVar3 = this->fRXPat->fPattern;
      lVar9 = index - pUVar3->chunkNativeStart;
      if (((lVar9 < 0) || (pUVar3->nativeIndexingLimit <= lVar9)) ||
         (0xdbff < (ushort)pUVar3->chunkContents[lVar9])) {
        utext_setNativeIndex_63(pUVar3,index);
      }
      else {
        pUVar3->chunkOffset = (int32_t)lVar9;
      }
    }
    else {
      offset = 0;
      local_30 = 0xffffffff;
      lVar9 = iVar8 - pUVar3->chunkNativeStart;
      _endIndex = pUVar3;
      if (((lVar9 < 0) || (pUVar3->nativeIndexingLimit <= lVar9)) ||
         (0xdbff < (ushort)pUVar3->chunkContents[lVar9])) {
        utext_setNativeIndex_63(pUVar3,iVar8);
      }
      else {
        pUVar3->chunkOffset = (int32_t)lVar9;
      }
      UVar6 = u_unescapeAt_63(uregex_utext_unescape_charAt_63,&offset,0x7fffffff,&endIndex);
      c->fChar = UVar6;
      if (offset == 0) {
        error(this,U_REGEX_BAD_ESCAPE_SEQUENCE);
      }
      else if (local_30 == offset) {
        pUVar3 = this->fRXPat->fPattern;
        iVar5 = pUVar3->chunkOffset;
        if (((long)iVar5 < 1) || (0xd7ff < (ushort)pUVar3->chunkContents[(long)iVar5 + -1])) {
          utext_previous32_63(pUVar3);
        }
        else {
          pUVar3->chunkOffset = iVar5 + -1;
        }
      }
      else if (local_30 != offset - 1U) {
        utext_moveIndex32_63(this->fRXPat->fPattern,offset + ~local_30);
      }
      this->fCharNum = this->fCharNum + (long)offset;
    }
    goto LAB_00265af6;
  }
  UVar6 = peekCharLL(this);
  if (UVar6 == 0x30) {
    c->fChar = 0;
    nextCharLL(this);
    for (iVar5 = 0; iVar5 != -3; iVar5 = iVar5 + -1) {
      uVar7 = peekCharLL(this);
      if (uVar7 - 0x38 < 0xfffffff8) {
        if (iVar5 == 0) {
          error(this,U_REGEX_BAD_ESCAPE_SEQUENCE);
        }
        break;
      }
      uVar2 = c->fChar;
      iVar1 = (uVar7 & 7) + uVar2 * 8;
      c->fChar = iVar1;
      if (iVar1 < 0x100) {
        nextCharLL(this);
      }
      else {
        c->fChar = uVar2 & 0x1fffffff;
      }
    }
    c->fQuoted = '\x01';
    goto LAB_00265af6;
  }
  UVar6 = peekCharLL(this);
  if (UVar6 != 0x51) {
    this->fInBackslashQuote = '\x01';
    goto LAB_00265af6;
  }
  this->fQuoteMode = '\x01';
  goto LAB_00265ad7;
}

Assistant:

void RegexCompile::nextChar(RegexPatternChar &c) {

    fScanIndex = UTEXT_GETNATIVEINDEX(fRXPat->fPattern);
    c.fChar    = nextCharLL();
    c.fQuoted  = FALSE;

    if (fQuoteMode) {
        c.fQuoted = TRUE;
        if ((c.fChar==chBackSlash && peekCharLL()==chE && ((fModeFlags & UREGEX_LITERAL) == 0)) ||
            c.fChar == (UChar32)-1) {
            fQuoteMode = FALSE;  //  Exit quote mode,
            nextCharLL();        // discard the E
            nextChar(c);         // recurse to get the real next char
        }
    }
    else if (fInBackslashQuote) {
        // The current character immediately follows a '\'
        // Don't check for any further escapes, just return it as-is.
        // Don't set c.fQuoted, because that would prevent the state machine from
        //    dispatching on the character.
        fInBackslashQuote = FALSE;
    }
    else
    {
        // We are not in a \Q quoted region \E of the source.
        //
        if (fModeFlags & UREGEX_COMMENTS) {
            //
            // We are in free-spacing and comments mode.
            //  Scan through any white space and comments, until we
            //  reach a significant character or the end of inut.
            for (;;) {
                if (c.fChar == (UChar32)-1) {
                    break;     // End of Input
                }
                if  (c.fChar == chPound && fEOLComments == TRUE) {
                    // Start of a comment.  Consume the rest of it, until EOF or a new line
                    for (;;) {
                        c.fChar = nextCharLL();
                        if (c.fChar == (UChar32)-1 ||  // EOF
                            c.fChar == chCR        ||
                            c.fChar == chLF        ||
                            c.fChar == chNEL       ||
                            c.fChar == chLS)       {
                            break;
                        }
                    }
                }
                // TODO:  check what Java & Perl do with non-ASCII white spaces.  Ticket 6061.
                if (PatternProps::isWhiteSpace(c.fChar) == FALSE) {
                    break;
                }
                c.fChar = nextCharLL();
            }
        }

        //
        //  check for backslash escaped characters.
        //
        if (c.fChar == chBackSlash) {
            int64_t pos = UTEXT_GETNATIVEINDEX(fRXPat->fPattern);
            if (RegexStaticSets::gStaticSets->fUnescapeCharSet.contains(peekCharLL())) {
                //
                // A '\' sequence that is handled by ICU's standard unescapeAt function.
                //   Includes \uxxxx, \n, \r, many others.
                //   Return the single equivalent character.
                //
                nextCharLL();                 // get & discard the peeked char.
                c.fQuoted = TRUE;

                if (UTEXT_FULL_TEXT_IN_CHUNK(fRXPat->fPattern, fPatternLength)) {
                    int32_t endIndex = (int32_t)pos;
                    c.fChar = u_unescapeAt(uregex_ucstr_unescape_charAt, &endIndex, (int32_t)fPatternLength, (void *)fRXPat->fPattern->chunkContents);

                    if (endIndex == pos) {
                        error(U_REGEX_BAD_ESCAPE_SEQUENCE);
                    }
                    fCharNum += endIndex - pos;
                    UTEXT_SETNATIVEINDEX(fRXPat->fPattern, endIndex);
                } else {
                    int32_t offset = 0;
                    struct URegexUTextUnescapeCharContext context = U_REGEX_UTEXT_UNESCAPE_CONTEXT(fRXPat->fPattern);

                    UTEXT_SETNATIVEINDEX(fRXPat->fPattern, pos);
                    c.fChar = u_unescapeAt(uregex_utext_unescape_charAt, &offset, INT32_MAX, &context);

                    if (offset == 0) {
                        error(U_REGEX_BAD_ESCAPE_SEQUENCE);
                    } else if (context.lastOffset == offset) {
                        UTEXT_PREVIOUS32(fRXPat->fPattern);
                    } else if (context.lastOffset != offset-1) {
                        utext_moveIndex32(fRXPat->fPattern, offset - context.lastOffset - 1);
                    }
                    fCharNum += offset;
                }
            }
            else if (peekCharLL() == chDigit0) {
                //  Octal Escape, using Java Regexp Conventions
                //    which are \0 followed by 1-3 octal digits.
                //    Different from ICU Unescape handling of Octal, which does not
                //    require the leading 0.
                //  Java also has the convention of only consuming 2 octal digits if
                //    the three digit number would be > 0xff
                //
                c.fChar = 0;
                nextCharLL();    // Consume the initial 0.
                int index;
                for (index=0; index<3; index++) {
                    int32_t ch = peekCharLL();
                    if (ch<chDigit0 || ch>chDigit7) {
                        if (index==0) {
                           // \0 is not followed by any octal digits.
                           error(U_REGEX_BAD_ESCAPE_SEQUENCE);
                        }
                        break;
                    }
                    c.fChar <<= 3;
                    c.fChar += ch&7;
                    if (c.fChar <= 255) {
                        nextCharLL();
                    } else {
                        // The last digit made the number too big.  Forget we saw it.
                        c.fChar >>= 3;
                    }
                }
                c.fQuoted = TRUE;
            }
            else if (peekCharLL() == chQ) {
                //  "\Q"  enter quote mode, which will continue until "\E"
                fQuoteMode = TRUE;
                nextCharLL();       // discard the 'Q'.
                nextChar(c);        // recurse to get the real next char.
            }
            else
            {
                // We are in a '\' escape that will be handled by the state table scanner.
                // Just return the backslash, but remember that the following char is to
                //  be taken literally.
                fInBackslashQuote = TRUE;
            }
        }
    }

    // re-enable # to end-of-line comments, in case they were disabled.
    // They are disabled by the parser upon seeing '(?', but this lasts for
    //  the fetching of the next character only.
    fEOLComments = TRUE;

    // putc(c.fChar, stdout);
}